

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StructureAnalyzer.cpp
# Opt level: O1

void __thiscall dg::vr::StructureAnalyzer::initializeCallRelations(StructureAnalyzer *this)

{
  CallBase *ptr;
  iterator __position;
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  char cVar3;
  VRLocation *pVVar4;
  op_iterator pUVar5;
  long lVar6;
  Argument *formalArg;
  Argument *pAVar7;
  ulong uVar8;
  pair<std::_Rb_tree_iterator<std::pair<const_llvm::Function_*const,_std::vector<dg::vr::CallRelation,_std::allocator<dg::vr::CallRelation>_>_>_>,_bool>
  pVar9;
  iterator_range<const_llvm::Argument_*> iVar10;
  Value *realArg;
  Argument *local_90;
  StructureAnalyzer *local_88;
  Argument *local_80;
  StructureAnalyzer *local_78;
  long local_70;
  long local_68;
  _Base_ptr *local_60;
  _Base_ptr local_58;
  long local_50;
  vector<dg::vr::CallRelation,_std::allocator<dg::vr::CallRelation>_> local_48;
  
  local_68 = *(long *)(*(long *)this + 0x20);
  local_70 = *(long *)this + 0x18;
  if (local_68 != local_70) {
    local_78 = this + 0xd0;
    local_88 = this;
    do {
      local_80 = (Argument *)(local_68 + -0x38);
      if (local_68 == 0) {
        local_80 = (Argument *)0x0;
      }
      cVar3 = llvm::GlobalValue::isDeclaration();
      pAVar7 = local_80;
      if (cVar3 == '\0') {
        local_90 = local_80;
        local_48.super__Vector_base<dg::vr::CallRelation,_std::allocator<dg::vr::CallRelation>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_48.super__Vector_base<dg::vr::CallRelation,_std::allocator<dg::vr::CallRelation>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_48.super__Vector_base<dg::vr::CallRelation,_std::allocator<dg::vr::CallRelation>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pVar9 = std::
                _Rb_tree<llvm::Function_const*,std::pair<llvm::Function_const*const,std::vector<dg::vr::CallRelation,std::allocator<dg::vr::CallRelation>>>,std::_Select1st<std::pair<llvm::Function_const*const,std::vector<dg::vr::CallRelation,std::allocator<dg::vr::CallRelation>>>>,std::less<llvm::Function_const*>,std::allocator<std::pair<llvm::Function_const*const,std::vector<dg::vr::CallRelation,std::allocator<dg::vr::CallRelation>>>>>
                ::
                _M_emplace_unique<llvm::Function_const*,std::vector<dg::vr::CallRelation,std::allocator<dg::vr::CallRelation>>>
                          ((_Rb_tree<llvm::Function_const*,std::pair<llvm::Function_const*const,std::vector<dg::vr::CallRelation,std::allocator<dg::vr::CallRelation>>>,std::_Select1st<std::pair<llvm::Function_const*const,std::vector<dg::vr::CallRelation,std::allocator<dg::vr::CallRelation>>>>,std::less<llvm::Function_const*>,std::allocator<std::pair<llvm::Function_const*const,std::vector<dg::vr::CallRelation,std::allocator<dg::vr::CallRelation>>>>>
                            *)local_78,(Function **)&local_90,&local_48);
        std::vector<dg::vr::CallRelation,_std::allocator<dg::vr::CallRelation>_>::~vector(&local_48)
        ;
        lVar6 = *(long *)(pAVar7 + 8);
        if (lVar6 != 0) {
          local_60 = &pVar9.first._M_node._M_node[1]._M_parent;
          local_58 = pVar9.first._M_node._M_node;
          do {
            p_Var2 = local_58;
            ptr = *(CallBase **)(lVar6 + 0x18);
            local_50 = lVar6;
            if ((ptr != (CallBase *)0x0) && (ptr[0x10] == (CallBase)0x53)) {
              __position._M_current = (CallRelation *)local_58[1]._M_left;
              if ((_Base_ptr)__position._M_current == local_58[1]._M_right) {
                std::vector<dg::vr::CallRelation,_std::allocator<dg::vr::CallRelation>_>::
                _M_realloc_insert<>((vector<dg::vr::CallRelation,_std::allocator<dg::vr::CallRelation>_>
                                     *)local_60,__position);
              }
              else {
                ((__position._M_current)->equalPairs).
                super__Vector_base<std::pair<const_llvm::Argument_*,_const_llvm::Value_*>,_std::allocator<std::pair<const_llvm::Argument_*,_const_llvm::Value_*>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                (__position._M_current)->callSite = (VRLocation *)0x0;
                ((__position._M_current)->equalPairs).
                super__Vector_base<std::pair<const_llvm::Argument_*,_const_llvm::Value_*>,_std::allocator<std::pair<const_llvm::Argument_*,_const_llvm::Value_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                ((__position._M_current)->equalPairs).
                super__Vector_base<std::pair<const_llvm::Argument_*,_const_llvm::Value_*>,_std::allocator<std::pair<const_llvm::Argument_*,_const_llvm::Value_*>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                local_58[1]._M_left = local_58[1]._M_left + 1;
              }
              p_Var1 = p_Var2[1]._M_left;
              pVVar4 = VRCodeGraph::getVRLocation
                                 (*(VRCodeGraph **)(local_88 + 8),(Instruction *)ptr);
              p_Var1[-1]._M_right = (_Base_ptr)pVVar4;
              iVar10 = llvm::Function::args((Function *)local_80);
              pAVar7 = iVar10.begin_iterator;
              if (pAVar7 != iVar10.end_iterator) {
                uVar8 = 0;
                do {
                  pUVar5 = llvm::CallBase::arg_end(ptr);
                  lVar6 = (long)ptr - (ulong)(uint)(*(int *)(ptr + 0x14) << 5);
                  if ((uint)((ulong)((long)pUVar5 - lVar6) >> 5) <= (uint)uVar8) break;
                  local_48.
                  super__Vector_base<dg::vr::CallRelation,_std::allocator<dg::vr::CallRelation>_>.
                  _M_impl.super__Vector_impl_data._M_start = *(pointer *)(lVar6 + uVar8 * 0x20);
                  local_90 = pAVar7;
                  std::
                  vector<std::pair<llvm::Argument_const*,llvm::Value_const*>,std::allocator<std::pair<llvm::Argument_const*,llvm::Value_const*>>>
                  ::emplace_back<llvm::Argument_const*,llvm::Value_const*&>
                            ((vector<std::pair<llvm::Argument_const*,llvm::Value_const*>,std::allocator<std::pair<llvm::Argument_const*,llvm::Value_const*>>>
                              *)(p_Var1 + -1),&local_90,(Value **)&local_48);
                  pAVar7 = pAVar7 + 0x28;
                  uVar8 = (ulong)((uint)uVar8 + 1);
                } while (pAVar7 != iVar10.end_iterator);
              }
            }
            lVar6 = *(long *)(local_50 + 8);
          } while (lVar6 != 0);
        }
      }
      local_68 = *(long *)(local_68 + 8);
    } while (local_68 != local_70);
  }
  return;
}

Assistant:

void StructureAnalyzer::initializeCallRelations() {
    for (const llvm::Function &function : module) {
        if (function.isDeclaration())
            continue;

        auto pair = callRelationsMap.emplace(&function,
                                             std::vector<CallRelation>());

        // for each location, where the function is called
        for (const llvm::Value *user : function.users()) {
            // get call from user
            const llvm::CallInst *call = llvm::dyn_cast<llvm::CallInst>(user);
            if (!call)
                continue;

            std::vector<CallRelation> &callRelations = pair.first->second;

            callRelations.emplace_back();
            CallRelation &callRelation = callRelations.back();

            // set pointer to the location from which the function is called
            callRelation.callSite = &codeGraph.getVRLocation(call);

            // set formal parameters equal to real
            unsigned argCount = 0;
            for (const llvm::Argument &formalArg : function.args()) {
                if (argCount >= llvmutils::getNumArgOperands(call))
                    break;
                const llvm::Value *realArg = call->getArgOperand(argCount);

                callRelation.equalPairs.emplace_back(&formalArg, realArg);
                ++argCount;
            }
        }
    }
}